

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.h
# Opt level: O2

int ReadSymbol(HuffmanCode *table,VP8LBitReader *br)

{
  byte bVar1;
  int iVar2;
  HuffmanCode *pHVar3;
  
  iVar2 = br->bit_pos_;
  pHVar3 = table + (br->val_ >> ((byte)iVar2 & 0x3f) & 0xff);
  bVar1 = pHVar3->bits;
  if (8 < bVar1) {
    iVar2 = iVar2 + 8;
    pHVar3 = pHVar3 + (ulong)pHVar3->value +
                      (ulong)(~(-1 << (bVar1 - 8 & 0x1f)) & (uint)(br->val_ >> ((byte)iVar2 & 0x3f))
                             );
    bVar1 = pHVar3->bits;
  }
  br->bit_pos_ = (uint)bVar1 + iVar2;
  return (int)pHVar3->value;
}

Assistant:

static WEBP_INLINE uint32_t VP8LPrefetchBits(VP8LBitReader* const br) {
  return (uint32_t)(br->val_ >> (br->bit_pos_ & (VP8L_LBITS - 1)));
}